

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

EvaluatedDimension * __thiscall
slang::ast::ASTContext::evalPackedDimension
          (EvaluatedDimension *__return_storage_ptr__,ASTContext *this,ElementSelectSyntax *syntax)

{
  SourceRange sourceRange;
  
  __return_storage_ptr__->kind = Unknown;
  (__return_storage_ptr__->range).left = 0;
  (__return_storage_ptr__->range).right = 0;
  __return_storage_ptr__->associativeType = (Type *)0x0;
  __return_storage_ptr__->queueMaxSize = 0;
  if (syntax->selector == (SelectorSyntax *)0x0) {
    if (((this->flags).m_bits & 0x1000000000) != 0) {
      __return_storage_ptr__->kind = DPIOpenArray;
      return __return_storage_ptr__;
    }
  }
  else {
    evalRangeDimension(this,syntax->selector,true,__return_storage_ptr__);
    if ((syntax->selector != (SelectorSyntax *)0x0) && (__return_storage_ptr__->kind != Associative)
       ) {
      return __return_storage_ptr__;
    }
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
  addDiag(this,(DiagCode)0x2d0006,sourceRange);
  return __return_storage_ptr__;
}

Assistant:

EvaluatedDimension ASTContext::evalPackedDimension(const ElementSelectSyntax& syntax) const {
    EvaluatedDimension result;
    if (syntax.selector) {
        evalRangeDimension(*syntax.selector, /* isPacked */ true, result);
    }
    else if (flags.has(ASTFlags::DPIArg)) {
        result.kind = DimensionKind::DPIOpenArray;
        return result;
    }

    if (!syntax.selector || result.kind == DimensionKind::Associative)
        addDiag(diag::DimensionRequiresConstRange, syntax.sourceRange());

    return result;
}